

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O2

void __thiscall addrman_tests::addrman_noevict::test_method(addrman_noevict *this)

{
  long lVar1;
  CService ipIn;
  CService ipIn_00;
  CService ipIn_01;
  CService ipIn_02;
  CService ipIn_03;
  __single_object _Var2;
  readonly_property65 rVar3;
  bool bVar4;
  uint uVar5;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator pvVar8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  initializer_list<CAddress> __l;
  const_string file_00;
  const_string file_01;
  initializer_list<CAddress> __l_00;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  initializer_list<CAddress> __l_01;
  const_string file_06;
  const_string file_07;
  initializer_list<CAddress> __l_02;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  initializer_list<CAddress> __l_03;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  undefined4 in_stack_fffffffffffffae8;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffaec;
  undefined4 uVar10;
  check_type cVar13;
  char *pcVar11;
  undefined8 in_stack_fffffffffffffaf8;
  char *pcVar12;
  undefined8 in_stack_fffffffffffffb00;
  undefined8 in_stack_fffffffffffffb08;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 local_359;
  assertion_result local_358;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  uint local_31c;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  __single_object addrman;
  CService local_1f0;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1b8;
  CService local_1a8;
  CService local_180;
  CService addr59;
  undefined1 local_130 [64];
  undefined1 local_f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_e0;
  CService local_d0;
  CService local_a8;
  CService addr36;
  CNetAddr source;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_130._0_4_ = GetCheckRatio(&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node);
  std::make_unique<AddrMan,NetGroupManager&,bool_const&,int>
            ((NetGroupManager *)&addrman,(bool *)&EMPTY_NETGROUPMAN,(int *)&DETERMINISTIC);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"252.2.2.2",(allocator<char> *)&addr36);
  ResolveIP(&source,(string *)local_130);
  std::__cxx11::string::~string((string *)local_130);
  uVar5 = 1;
  while (local_370 = (char *)CONCAT44(local_370._4_4_,uVar5), uVar5 < 0x24) {
    util::ToString<unsigned_int>((string *)&addr59,(uint *)&local_370);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                   "250.1.1.",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr59);
    ResolveService(&addr36,(string *)local_130,0);
    std::__cxx11::string::~string((string *)local_130);
    std::__cxx11::string::~string((string *)&addr59);
    local_208 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_200 = "";
    local_218 = &boost::unit_test::basic_cstring<char_const>::null;
    local_210 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x359;
    file.m_begin = (iterator)&local_208;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_218,msg);
    _Var2 = addrman;
    CService::CService(&local_a8,&addr36);
    ipIn.super_CNetAddr.m_addr._union._4_4_ = in_stack_fffffffffffffaec;
    ipIn.super_CNetAddr.m_addr._union._0_4_ = in_stack_fffffffffffffae8;
    ipIn.super_CNetAddr.m_addr._union._8_8_ = (undefined8)_cVar13;
    ipIn.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffffaf8;
    ipIn.super_CNetAddr.m_net = (int)in_stack_fffffffffffffb00;
    ipIn.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
    ipIn._32_8_ = in_stack_fffffffffffffb08;
    CAddress::CAddress((CAddress *)local_130,ipIn,(ServiceFlags)&local_a8);
    __l._M_len = 1;
    __l._M_array = (CAddress *)local_130;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)local_1c8,__l,
               (allocator_type *)&local_31c);
    rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         AddrMan::Add((AddrMan *)
                      _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                      super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                      super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                      (vector<CAddress,_std::allocator<CAddress>_> *)local_1c8,&source,(seconds)0x0)
    ;
    local_f0[0] = rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
    local_f0._8_8_ = (element_type *)0x0;
    aStack_e0._M_allocated_capacity = 0;
    local_358._0_8_ = "addrman->Add({CAddress(addr, NODE_NONE)}, source)";
    local_358.m_message.px = (element_type *)0xb6569a;
    addr59.super_CNetAddr.m_addr._union._8_8_ =
         addr59.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
    addr59.super_CNetAddr.m_addr._union.indirect_contents.indirect =
         (char *)&PTR__lazy_ostream_011481f0;
    addr59.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
    addr59.super_CNetAddr._24_8_ = &local_358;
    local_228 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_220 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_f0,(lazy_ostream *)&addr59,1,0,WARN,_cVar13,
               (size_t)&local_228,0x359);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_e0._M_allocated_capacity);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)local_1c8);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_130);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_a8);
    local_238 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_230 = "";
    local_248 = &boost::unit_test::basic_cstring<char_const>::null;
    local_240 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x35c;
    file_00.m_begin = (iterator)&local_238;
    msg_00.m_end = pvVar8;
    msg_00.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_248,
               msg_00);
    _Var2 = addrman;
    tVar6 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
    bVar4 = AddrMan::Good((AddrMan *)
                          _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                          _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                          super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr36,
                          (NodeSeconds)tVar6.__d.__r);
    addr59.super_CNetAddr.m_addr._union.direct[0] = bVar4;
    addr59.super_CNetAddr.m_addr._union._8_8_ = 0;
    addr59.super_CNetAddr.m_addr._size = 0;
    addr59.super_CNetAddr.m_addr._20_4_ = 0;
    local_f0._0_8_ = "addrman->Good(addr)";
    local_f0._8_8_ = "";
    local_130[8] = '\0';
    local_130._0_8_ = &PTR__lazy_ostream_011481f0;
    local_130._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_130._24_8_ = local_f0;
    local_258 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_250 = "";
    in_stack_fffffffffffffae8 = 0;
    in_stack_fffffffffffffaec = 0;
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&addr59,(lazy_ostream *)local_130,1,0,WARN,_cVar13,
               (size_t)&local_258,0x35c);
    boost::detail::shared_count::~shared_count((shared_count *)&addr59.super_CNetAddr.m_addr._size);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr36);
    uVar5 = (uint)local_370 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"250.1.1.36",(allocator<char> *)&addr59);
  ResolveService(&addr36,(string *)local_130,0);
  std::__cxx11::string::~string((string *)local_130);
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x361;
  file_01.m_begin = (iterator)&local_268;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_278,
             msg_01);
  _Var2 = addrman;
  CService::CService(&local_d0,&addr36);
  ipIn_00.super_CNetAddr.m_addr._union._4_4_ = in_stack_fffffffffffffaec;
  ipIn_00.super_CNetAddr.m_addr._union._0_4_ = in_stack_fffffffffffffae8;
  ipIn_00.super_CNetAddr.m_addr._union._8_8_ = (undefined8)_cVar13;
  ipIn_00.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffffaf8;
  ipIn_00.super_CNetAddr.m_net = (int)in_stack_fffffffffffffb00;
  ipIn_00.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
  ipIn_00._32_8_ = in_stack_fffffffffffffb08;
  CAddress::CAddress((CAddress *)local_130,ipIn_00,(ServiceFlags)&local_d0);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_130;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)local_1c8,__l_00,
             (allocator_type *)&local_370);
  rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       AddrMan::Add((AddrMan *)
                    _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                    (vector<CAddress,_std::allocator<CAddress>_> *)local_1c8,&source,(seconds)0x0);
  local_f0[0] = rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
  local_f0._8_8_ = (element_type *)0x0;
  aStack_e0._M_allocated_capacity = 0;
  local_358._0_8_ = "addrman->Add({CAddress(addr36, NODE_NONE)}, source)";
  local_358.m_message.px = (element_type *)0xb661fb;
  addr59.super_CNetAddr.m_addr._union._8_8_ =
       addr59.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr59.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_011481f0;
  addr59.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr59.super_CNetAddr._24_8_ = &local_358;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_280 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_f0,(lazy_ostream *)&addr59,1,0,WARN,_cVar13,
             (size_t)&local_288,0x361);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_e0._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)local_1c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_130);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_d0);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x362;
  file_02.m_begin = (iterator)&local_298;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2a8,
             msg_02);
  _Var2 = addrman;
  tVar6 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  bVar4 = AddrMan::Good((AddrMan *)
                        _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr36,
                        (NodeSeconds)tVar6.__d.__r);
  addr59.super_CNetAddr.m_addr._union.direct[0] = !bVar4;
  addr59.super_CNetAddr.m_addr._union._8_8_ = 0;
  addr59.super_CNetAddr.m_addr._size = 0;
  addr59.super_CNetAddr.m_addr._20_4_ = 0;
  local_f0._0_8_ = "!addrman->Good(addr36)";
  local_f0._8_8_ = "";
  local_130[8] = '\0';
  local_130._0_8_ = &PTR__lazy_ostream_011481f0;
  local_130._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2b0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_130._24_8_ = (assertion_result *)local_f0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&addr59,(lazy_ostream *)local_130,1,0,WARN,_cVar13,
             (size_t)&local_2b8,0x362);
  boost::detail::shared_count::~shared_count((shared_count *)&addr59.super_CNetAddr.m_addr._size);
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x363;
  file_03.m_begin = (iterator)&local_2c8;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2d8,
             msg_03);
  addr59.super_CNetAddr.m_addr._union._8_8_ =
       addr59.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
  addr59.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)&PTR__lazy_ostream_011480b0;
  addr59.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr59.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2e0 = "";
  AddrMan::SelectTriedCollision
            ((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              *)local_130,
             (AddrMan *)
             addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl);
  CService::ToStringAddrPort_abi_cxx11_((string *)local_f0,(CService *)local_130);
  pcVar12 = "\"250.1.1.19:0\"";
  pcVar11 = "250.1.1.19:0";
  pvVar8 = (iterator)0x2;
  pvVar7 = local_f0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[13]>
            (&addr59,&local_2e8,0x363,1,2,pvVar7,0xb66100);
  std::__cxx11::string::~string((string *)local_f0);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_130);
  AddrMan::ResolveCollisions
            ((AddrMan *)
             addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl);
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x369;
  file_04.m_begin = (iterator)&local_2f8;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_308,
             msg_04);
  AddrMan::SelectTriedCollision
            ((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              *)local_130,
             (AddrMan *)
             addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl);
  CService::ToStringAddrPort_abi_cxx11_((string *)&addr59,(CService *)local_130);
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &addr59,"[::]:0");
  local_1c8[0] = bVar4;
  local_1c8._8_8_ = (element_type *)0x0;
  aStack_1b8._M_allocated_capacity = 0;
  local_358._0_8_ = "addrman->SelectTriedCollision().first.ToStringAddrPort() == \"[::]:0\"";
  local_358.m_message.px = (element_type *)0xb660b8;
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  aStack_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_e0._8_8_ = &local_358;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_310 = "";
  uVar9 = 0;
  uVar10 = 0;
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1c8,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pcVar11,
             (size_t)&local_318,0x369);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_1b8._M_allocated_capacity);
  std::__cxx11::string::~string((string *)&addr59);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_130);
  for (local_31c = 0x25; local_31c < 0x3b; local_31c = local_31c + 1) {
    util::ToString<unsigned_int>((string *)local_f0,&local_31c);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                   "250.1.1.",(string *)local_f0);
    ResolveService(&addr59,(string *)local_130,0);
    std::__cxx11::string::~string((string *)local_130);
    std::__cxx11::string::~string((string *)local_f0);
    local_330 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_328 = "";
    local_340 = &boost::unit_test::basic_cstring<char_const>::null;
    local_338 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x36e;
    file_05.m_begin = (iterator)&local_330;
    msg_05.m_end = pvVar8;
    msg_05.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_340,
               msg_05);
    _Var2 = addrman;
    CService::CService(&local_180,&addr59);
    ipIn_01.super_CNetAddr.m_addr._union._4_4_ = uVar10;
    ipIn_01.super_CNetAddr.m_addr._union._0_4_ = uVar9;
    ipIn_01.super_CNetAddr.m_addr._union._8_8_ = pcVar11;
    ipIn_01.super_CNetAddr.m_addr._16_8_ = pcVar12;
    ipIn_01.super_CNetAddr.m_net = (int)in_stack_fffffffffffffb00;
    ipIn_01.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
    ipIn_01._32_8_ = in_stack_fffffffffffffb08;
    CAddress::CAddress((CAddress *)local_130,ipIn_01,(ServiceFlags)&local_180);
    __l_01._M_len = 1;
    __l_01._M_array = (CAddress *)local_130;
    std::vector<CAddress,_std::allocator<CAddress>_>::vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)&local_358,__l_01,
               (allocator_type *)&local_359);
    bVar4 = AddrMan::Add((AddrMan *)
                         _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                         _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                         super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                         (vector<CAddress,_std::allocator<CAddress>_> *)&local_358,&source,
                         (seconds)0x0);
    local_1c8[0] = bVar4;
    local_1c8._8_8_ = (element_type *)0x0;
    aStack_1b8._M_allocated_capacity = 0;
    local_370 = "addrman->Add({CAddress(addr, NODE_NONE)}, source)";
    local_368 = "";
    local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
    local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
    aStack_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_e0._8_8_ = &local_370;
    local_380 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_378 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_1c8,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pcVar11,
               (size_t)&local_380,0x36e);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_1b8._M_allocated_capacity);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)&local_358);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_130);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_180);
    local_390 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_388 = "";
    local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_398 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x36f;
    file_06.m_begin = (iterator)&local_390;
    msg_06.m_end = pvVar8;
    msg_06.m_begin = pvVar7;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3a0,
               msg_06);
    _Var2 = addrman;
    tVar6 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
    bVar4 = AddrMan::Good((AddrMan *)
                          _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                          _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                          super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr59,
                          (NodeSeconds)tVar6.__d.__r);
    local_f0[0] = bVar4;
    local_f0._8_8_ = (element_type *)0x0;
    aStack_e0._M_allocated_capacity = 0;
    local_1c8._0_8_ = "addrman->Good(addr)";
    local_1c8._8_8_ = "";
    local_130[8] = '\0';
    local_130._0_8_ = &PTR__lazy_ostream_011481f0;
    local_130._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_130._24_8_ = local_1c8;
    local_3b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
    ;
    local_3a8 = "";
    uVar9 = 0;
    uVar10 = 0;
    pvVar7 = &DAT_00000001;
    pvVar8 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_f0,(lazy_ostream *)local_130,1,0,WARN,(check_type)pcVar11,
               (size_t)&local_3b0,0x36f);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_e0._M_allocated_capacity);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr59);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"250.1.1.59",(allocator<char> *)local_f0);
  ResolveService(&addr59,(string *)local_130,0);
  std::__cxx11::string::~string((string *)local_130);
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x374;
  file_07.m_begin = (iterator)&local_3c0;
  msg_07.m_end = pvVar8;
  msg_07.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_3d0,
             msg_07);
  _Var2 = addrman;
  CService::CService(&local_1a8,&addr59);
  ipIn_02.super_CNetAddr.m_addr._union._4_4_ = uVar10;
  ipIn_02.super_CNetAddr.m_addr._union._0_4_ = uVar9;
  ipIn_02.super_CNetAddr.m_addr._union._8_8_ = pcVar11;
  ipIn_02.super_CNetAddr.m_addr._16_8_ = pcVar12;
  ipIn_02.super_CNetAddr.m_net = (int)in_stack_fffffffffffffb00;
  ipIn_02.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
  ipIn_02._32_8_ = in_stack_fffffffffffffb08;
  CAddress::CAddress((CAddress *)local_130,ipIn_02,(ServiceFlags)&local_1a8);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_130;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_358,__l_02,
             (allocator_type *)&local_31c);
  bVar4 = AddrMan::Add((AddrMan *)
                       _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&local_358,&source,
                       (seconds)0x0);
  local_1c8[0] = bVar4;
  local_1c8._8_8_ = (element_type *)0x0;
  aStack_1b8._M_allocated_capacity = 0;
  local_370 = "addrman->Add({CAddress(addr59, NODE_NONE)}, source)";
  local_368 = "";
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  aStack_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_e0._8_8_ = &local_370;
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_3d8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1c8,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pcVar11,
             (size_t)&local_3e0,0x374);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_1b8._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_358);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_130);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1a8);
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x375;
  file_08.m_begin = (iterator)&local_3f0;
  msg_08.m_end = pvVar8;
  msg_08.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_400,
             msg_08);
  _Var2 = addrman;
  tVar6 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  bVar4 = AddrMan::Good((AddrMan *)
                        _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr59,
                        (NodeSeconds)tVar6.__d.__r);
  local_f0[0] = !bVar4;
  local_f0._8_8_ = (element_type *)0x0;
  aStack_e0._M_allocated_capacity = 0;
  local_1c8._0_8_ = "!addrman->Good(addr59)";
  local_1c8._8_8_ = "";
  local_130[8] = '\0';
  local_130._0_8_ = &PTR__lazy_ostream_011481f0;
  local_130._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_408 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_130._24_8_ = (assertion_result *)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_f0,(lazy_ostream *)local_130,1,0,WARN,(check_type)pcVar11,
             (size_t)&local_410,0x375);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_e0._M_allocated_capacity);
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x377;
  file_09.m_begin = (iterator)&local_420;
  msg_09.m_end = pvVar8;
  msg_09.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_430,
             msg_09);
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_f0._0_8_ = &PTR__lazy_ostream_011480b0;
  aStack_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_e0._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_438 = "";
  AddrMan::SelectTriedCollision
            ((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              *)local_130,
             (AddrMan *)
             addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl);
  CService::ToStringAddrPort_abi_cxx11_((string *)local_1c8,(CService *)local_130);
  pcVar12 = "\"250.1.1.10:0\"";
  pcVar11 = "250.1.1.10:0";
  uVar9 = 0xb66100;
  uVar10 = 0;
  pvVar8 = (iterator)0x2;
  pvVar7 = local_1c8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[13]>
            (local_f0,&local_440,0x377,1);
  std::__cxx11::string::~string((string *)local_1c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_130);
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x37a;
  file_10.m_begin = (iterator)&local_450;
  msg_10.m_end = pvVar7;
  msg_10.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_460,
             msg_10);
  _Var2 = addrman;
  CService::CService(&local_1f0,&addr36);
  ipIn_03.super_CNetAddr.m_addr._union._4_4_ = uVar10;
  ipIn_03.super_CNetAddr.m_addr._union._0_4_ = uVar9;
  ipIn_03.super_CNetAddr.m_addr._union._8_8_ = pcVar11;
  ipIn_03.super_CNetAddr.m_addr._16_8_ = pcVar12;
  ipIn_03.super_CNetAddr.m_net = (int)in_stack_fffffffffffffb00;
  ipIn_03.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffffb00 >> 0x20);
  ipIn_03._32_8_ = in_stack_fffffffffffffb08;
  CAddress::CAddress((CAddress *)local_130,ipIn_03,(ServiceFlags)&local_1f0);
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)local_130;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_358,__l_03,
             (allocator_type *)&local_31c);
  bVar4 = AddrMan::Add((AddrMan *)
                       _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&local_358,&source,
                       (seconds)0x0);
  local_1c8[0] = !bVar4;
  local_1c8._8_8_ = (element_type *)0x0;
  aStack_1b8._M_allocated_capacity = 0;
  local_370 = "!addrman->Add({CAddress(addr36, NODE_NONE)}, source)";
  local_368 = "";
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  aStack_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_e0._8_8_ = &local_370;
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_468 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1c8,(lazy_ostream *)local_f0,1,0,WARN,(check_type)pcVar11,
             (size_t)&local_470,0x37a);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_1b8._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_358);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_130);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1f0);
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x37d;
  file_11.m_begin = (iterator)&local_480;
  msg_11.m_end = pvVar8;
  msg_11.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_490,
             msg_11);
  _Var2 = addrman;
  tVar6 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  bVar4 = AddrMan::Good((AddrMan *)
                        _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr36,
                        (NodeSeconds)tVar6.__d.__r);
  local_f0[0] = !bVar4;
  local_f0._8_8_ = (element_type *)0x0;
  aStack_e0._M_allocated_capacity = 0;
  local_1c8._0_8_ = "!addrman->Good(addr36)";
  local_1c8._8_8_ = "";
  local_130[8] = '\0';
  local_130._0_8_ = &PTR__lazy_ostream_011481f0;
  local_130._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_498 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_130._24_8_ = (assertion_result *)local_1c8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_f0,(lazy_ostream *)local_130,1,0,WARN,(check_type)pcVar11,
             (size_t)&local_4a0,0x37d);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_e0._M_allocated_capacity);
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x37e;
  file_12.m_begin = (iterator)&local_4b0;
  msg_12.m_end = pvVar8;
  msg_12.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_4c0,
             msg_12);
  AddrMan::SelectTriedCollision
            ((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              *)local_130,
             (AddrMan *)
             addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl);
  CService::ToStringAddrPort_abi_cxx11_((string *)local_f0,(CService *)local_130);
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_f0,"[::]:0");
  local_358.m_message.px = (element_type *)0x0;
  local_358.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_370 = "addrman->SelectTriedCollision().first.ToStringAddrPort() != \"[::]:0\"";
  local_368 = "";
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_011481f0;
  aStack_1b8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_1b8._8_8_ = &local_370;
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_4c8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_358.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar4;
  boost::test_tools::tt_detail::report_assertion
            (&local_358,(lazy_ostream *)local_1c8,1,0,WARN,(check_type)pcVar11,(size_t)&local_4d0,
             0x37e);
  boost::detail::shared_count::~shared_count(&local_358.m_message.pn);
  std::__cxx11::string::~string((string *)local_f0);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_130);
  AddrMan::ResolveCollisions
            ((AddrMan *)
             addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl);
  local_4e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_4d8 = "";
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x382;
  file_13.m_begin = (iterator)&local_4e0;
  msg_13.m_end = pvVar8;
  msg_13.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_4f0,
             msg_13);
  AddrMan::SelectTriedCollision
            ((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              *)local_130,
             (AddrMan *)
             addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl);
  CService::ToStringAddrPort_abi_cxx11_((string *)local_f0,(CService *)local_130);
  local_358.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0
                       ,"[::]:0");
  local_358.m_message.px = (element_type *)0x0;
  local_358.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_370 = "addrman->SelectTriedCollision().first.ToStringAddrPort() == \"[::]:0\"";
  local_368 = "";
  local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
  local_1c8._0_8_ = &PTR__lazy_ostream_011481f0;
  aStack_1b8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_1b8._8_8_ = &local_370;
  boost::test_tools::tt_detail::report_assertion
            (&local_358,(lazy_ostream *)local_1c8,1,0,WARN,(check_type)pcVar11,
             (size_t)&stack0xfffffffffffffb00,0x382);
  boost::detail::shared_count::~shared_count(&local_358.m_message.pn);
  std::__cxx11::string::~string((string *)local_f0);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_130);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr59);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr36);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&source.m_addr);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_noevict)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));

    // Add 35 addresses.
    CNetAddr source = ResolveIP("252.2.2.2");
    for (unsigned int i = 1; i < 36; i++) {
        CService addr = ResolveService("250.1.1." + ToString(i));
        BOOST_CHECK(addrman->Add({CAddress(addr, NODE_NONE)}, source));

        // No collision yet.
        BOOST_CHECK(addrman->Good(addr));
    }

    // Collision in tried table between 36 and 19.
    CService addr36 = ResolveService("250.1.1.36");
    BOOST_CHECK(addrman->Add({CAddress(addr36, NODE_NONE)}, source));
    BOOST_CHECK(!addrman->Good(addr36));
    BOOST_CHECK_EQUAL(addrman->SelectTriedCollision().first.ToStringAddrPort(), "250.1.1.19:0");

    // 36 should be discarded and 19 not evicted.
    // This means we keep 19 in the tried table and
    // 36 stays in the new table.
    addrman->ResolveCollisions();
    BOOST_CHECK(addrman->SelectTriedCollision().first.ToStringAddrPort() == "[::]:0");

    // Lets create two collisions.
    for (unsigned int i = 37; i < 59; i++) {
        CService addr = ResolveService("250.1.1." + ToString(i));
        BOOST_CHECK(addrman->Add({CAddress(addr, NODE_NONE)}, source));
        BOOST_CHECK(addrman->Good(addr));
    }

    // Cause a collision in the tried table.
    CService addr59 = ResolveService("250.1.1.59");
    BOOST_CHECK(addrman->Add({CAddress(addr59, NODE_NONE)}, source));
    BOOST_CHECK(!addrman->Good(addr59));

    BOOST_CHECK_EQUAL(addrman->SelectTriedCollision().first.ToStringAddrPort(), "250.1.1.10:0");

    // Cause a second collision in the new table.
    BOOST_CHECK(!addrman->Add({CAddress(addr36, NODE_NONE)}, source));

    // 36 still cannot be moved from new to tried due to colliding with 19
    BOOST_CHECK(!addrman->Good(addr36));
    BOOST_CHECK(addrman->SelectTriedCollision().first.ToStringAddrPort() != "[::]:0");

    // Resolve all collisions.
    addrman->ResolveCollisions();
    BOOST_CHECK(addrman->SelectTriedCollision().first.ToStringAddrPort() == "[::]:0");
}